

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

uchar __thiscall RegVmLoweredFunction::GetRegister(RegVmLoweredFunction *this)

{
  bool bVar1;
  byte *pbVar2;
  unsigned_short *puVar3;
  byte local_19;
  uchar reg;
  RegVmLoweredFunction *this_local;
  
  bVar1 = SmallArray<unsigned_char,_16U>::empty(&this->freedRegisters);
  if (bVar1) {
    if (this->nextRegister == '\0') {
      this->hasRegisterOverflow = true;
      return 0xff;
    }
    local_19 = this->nextRegister;
    this->nextRegister = this->nextRegister + '\x01';
  }
  else {
    pbVar2 = SmallArray<unsigned_char,_16U>::back(&this->freedRegisters);
    local_19 = *pbVar2;
    SmallArray<unsigned_char,_16U>::pop_back(&this->freedRegisters);
  }
  puVar3 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)local_19);
  if (*puVar3 == 0) {
    puVar3 = FixedArray<unsigned_short,_256U>::operator[](&this->registerUsers,(uint)local_19);
    *puVar3 = *puVar3 + 1;
    return local_19;
  }
  __assert_fail("registerUsers[reg] == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                ,0x6d,"unsigned char RegVmLoweredFunction::GetRegister()");
}

Assistant:

unsigned char RegVmLoweredFunction::GetRegister()
{
	unsigned char reg = 0;

	if(!freedRegisters.empty())
	{
		reg = freedRegisters.back();
		freedRegisters.pop_back();
	}
	else
	{
		// We start from rvrrCount register, so 0 means that we wrapped around from 255
		if(nextRegister == 0)
		{
			hasRegisterOverflow = true;
			return 255;
		}

		reg = nextRegister;
		nextRegister++;
	}

	assert(registerUsers[reg] == 0);
	registerUsers[reg]++;

	return reg;
}